

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

size_t Catch::listTags(Config *config)

{
  size_type *this;
  TestCase *pTVar1;
  size_t sVar2;
  bool bVar3;
  int iVar4;
  IRegistryHub *pIVar5;
  undefined4 extraout_var;
  undefined8 *puVar6;
  iterator iVar7;
  _Base_ptr p_Var8;
  ulong uVar9;
  ostream *poVar10;
  ulong uVar11;
  TestCase *testCase;
  char cVar12;
  char *pcVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  string tagName;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  tagCounts;
  TextAttributes local_c8;
  Text wrapper;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pcVar13 = "Matching tags:\n";
  if ((config->m_filterSets).
      super__Vector_base<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (config->m_filterSets).
      super__Vector_base<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pcVar13 = "All available tags:\n";
  }
  std::operator<<((ostream *)&std::cout,pcVar13);
  pIVar5 = getRegistryHub();
  iVar4 = (*pIVar5->_vptr_IRegistryHub[3])(pIVar5);
  puVar6 = (undefined8 *)
           (**(code **)(*(long *)CONCAT44(extraout_var,iVar4) + 0x10))
                     ((long *)CONCAT44(extraout_var,iVar4));
  testCase = (TestCase *)*puVar6;
  pTVar1 = (TestCase *)puVar6[1];
  tagCounts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &tagCounts._M_t._M_impl.super__Rb_tree_header._M_header;
  tagCounts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  tagCounts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  tagCounts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  uVar11 = 0;
  tagCounts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       tagCounts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (; testCase != pTVar1; testCase = testCase + 1) {
    bVar3 = matchesFilters(&config->m_filterSets,testCase);
    if (bVar3) {
      for (p_Var8 = (testCase->super_TestCaseInfo).tags._M_t._M_impl.super__Rb_tree_header._M_header
                    ._M_left;
          (_Rb_tree_header *)p_Var8 !=
          &(testCase->super_TestCaseInfo).tags._M_t._M_impl.super__Rb_tree_header;
          p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
        std::__cxx11::string::string((string *)&tagName,(string *)(p_Var8 + 1));
        if (uVar11 <= tagName._M_string_length) {
          uVar11 = tagName._M_string_length;
        }
        iVar7 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                        *)&tagCounts,&tagName);
        if ((_Rb_tree_header *)iVar7._M_node == &tagCounts._M_t._M_impl.super__Rb_tree_header) {
          std::__cxx11::string::string((string *)&wrapper,(string *)&tagName);
          wrapper.attr.initialIndent._0_4_ = 1;
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,int>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                      *)&tagCounts,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                      *)&wrapper);
          std::__cxx11::string::~string((string *)&wrapper);
        }
        else {
          iVar7._M_node[2]._M_color = iVar7._M_node[2]._M_color + _S_black;
        }
        std::__cxx11::string::~string((string *)&tagName);
      }
    }
  }
  uVar9 = 0x46;
  if (uVar11 + 4 < 0x46) {
    uVar9 = uVar11 + 4;
  }
  for (p_Var8 = tagCounts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      sVar2 = tagCounts._M_t._M_impl.super__Rb_tree_header._M_node_count,
      (_Rb_tree_header *)p_Var8 != &tagCounts._M_t._M_impl.super__Rb_tree_header;
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
    std::operator+(&local_50,"[",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var8 + 1)
                  );
    std::operator+(&tagName,&local_50,"]");
    local_c8.initialIndent = 0xffffffffffffffff;
    local_c8.tabChar = '\t';
    local_c8.indent = 2;
    local_c8.width = uVar9;
    Text::Text(&wrapper,&tagName,&local_c8);
    std::__cxx11::string::~string((string *)&tagName);
    std::__cxx11::string::~string((string *)&local_50);
    operator<<((ostream *)&std::cout,&wrapper);
    uVar11 = wrapper.lines.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]._M_string_length;
    (**(code **)(*Colour::impl + 0x10))(Colour::impl,0x17);
    cVar12 = ((char)uVar9 + '\x02') - (char)uVar11;
    if (uVar9 <= uVar11) {
      cVar12 = '\x02';
    }
    tagName._M_dataplus._M_p = (pointer)&tagName.field_2;
    std::__cxx11::string::_M_construct((ulong)&tagName,cVar12);
    std::operator<<((ostream *)&std::cout,(string *)&tagName);
    this_00 = &tagName;
    std::__cxx11::string::~string((string *)&tagName);
    Colour::~Colour((Colour *)this_00);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cout,p_Var8[2]._M_color);
    std::operator<<(poVar10,"\n");
    Text::~Text(&wrapper);
  }
  std::__cxx11::string::string((string *)&tagName,"tag",(allocator *)&local_50);
  this = &wrapper.str._M_string_length;
  wrapper.str._M_dataplus._M_p = (pointer)sVar2;
  std::__cxx11::string::string((string *)this,(string *)&tagName);
  poVar10 = operator<<((ostream *)&std::cout,(pluralise *)&wrapper);
  poVar10 = std::operator<<(poVar10,"\n");
  std::endl<char,std::char_traits<char>>(poVar10);
  std::__cxx11::string::~string((string *)this);
  std::__cxx11::string::~string((string *)&tagName);
  sVar2 = tagCounts._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree(&tagCounts._M_t);
  return sVar2;
}

Assistant:

std::vector<TestCaseFilters> const& filters() const {
            return m_filterSets;
        }